

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
::dense_hashtable(dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                  *this,dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                        *ht,size_type min_buckets_wanted)

{
  size_type sVar1;
  vector<CMString,_std::allocator<CMString>_> *pvVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 uVar6;
  uint uVar7;
  undefined7 uVar8;
  ulong uVar9;
  size_type sVar10;
  float fVar11;
  
  sVar10 = (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
           enlarge_threshold_;
  sVar1 = (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
          shrink_threshold_;
  fVar11 = (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
           shrink_factor_;
  bVar3 = (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
          consider_shrink_;
  bVar4 = (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
          use_empty_;
  bVar5 = (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
          use_deleted_;
  uVar6 = (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
          field_0x1b;
  uVar7 = (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
          num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
  enlarge_factor_ =
       (ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
       enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
  shrink_factor_ = fVar11;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
  consider_shrink_ = bVar3;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.use_empty_ =
       bVar4;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.use_deleted_
       = bVar5;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.field_0x1b =
       uVar6;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
  num_ht_copies_ = uVar7;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
  enlarge_threshold_ = sVar10;
  (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
  shrink_threshold_ = sVar1;
  (this->key_info).delkey = (ht->key_info).delkey;
  this->num_buckets = 0;
  this->num_deleted = 0;
  this->num_elements = 0;
  uVar8 = *(undefined7 *)&(ht->val_info).emptyval.field_0x1;
  pvVar2 = (ht->val_info).emptyval.second;
  (this->val_info).emptyval.first = (ht->val_info).emptyval.first;
  *(undefined7 *)&(this->val_info).emptyval.field_0x1 = uVar8;
  (this->val_info).emptyval.second = pvVar2;
  this->table = (pointer)0x0;
  if ((ht->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.use_empty_
      != false) {
    fVar11 = (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
             enlarge_factor_ * 0.0;
    uVar9 = (ulong)fVar11;
    (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
    enlarge_threshold_ = (long)(fVar11 - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9;
    fVar11 = (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
             shrink_factor_ * 0.0;
    uVar9 = (ulong)fVar11;
    (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
    shrink_threshold_ = (long)(fVar11 - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9;
    (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
    consider_shrink_ = false;
    copy_from(this,ht,min_buckets_wanted);
    return;
  }
  if (ht->num_elements == ht->num_deleted) {
    sVar10 = sparsehash_internal::sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>::
             min_buckets((sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4> *)this,0,
                         min_buckets_wanted);
    this->num_buckets = sVar10;
    fVar11 = (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
             enlarge_factor_ * (float)sVar10;
    uVar9 = (ulong)fVar11;
    (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
    enlarge_threshold_ = (long)(fVar11 - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9;
    fVar11 = (float)sVar10 *
             (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
             shrink_factor_;
    uVar9 = (ulong)fVar11;
    (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
    shrink_threshold_ = (long)(fVar11 - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9;
    (this->settings).super_sh_hashtable_settings<char,_std::hash<char>,_unsigned_long,_4>.
    consider_shrink_ = false;
    return;
  }
  __assert_fail("ht.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/sparsehash/src/sparsehash/internal/densehashtable.h"
                ,0x2d3,
                "google::dense_hashtable<std::pair<const char, std::vector<CMString> *>, char, std::hash<char>, google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, google::dense_hash_map<char, std::vector<CMString> *>::SetKey, std::equal_to<char>, google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>>::dense_hashtable(const dense_hashtable<Value, Key, HashFcn, ExtractKey, SetKey, EqualKey, Alloc> &, size_type) [Value = std::pair<const char, std::vector<CMString> *>, Key = char, HashFcn = std::hash<char>, ExtractKey = google::dense_hash_map<char, std::vector<CMString> *>::SelectKey, SetKey = google::dense_hash_map<char, std::vector<CMString> *>::SetKey, EqualKey = std::equal_to<char>, Alloc = google::libc_allocator_with_realloc<std::pair<const char, std::vector<CMString> *>>]"
               );
}

Assistant:

dense_hashtable(const dense_hashtable& ht,
                  size_type min_buckets_wanted = HT_DEFAULT_STARTING_BUCKETS)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        num_elements(0),
        num_buckets(0),
        val_info(ht.val_info),
        table(NULL) {
    if (!ht.settings.use_empty()) {
      // If use_empty isn't set, copy_from will crash, so we do our own copying.
      assert(ht.empty());
      num_buckets = settings.min_buckets(ht.size(), min_buckets_wanted);
      settings.reset_thresholds(bucket_count());
      return;
    }
    settings.reset_thresholds(bucket_count());
    copy_from(ht, min_buckets_wanted);   // copy_from() ignores deleted entries
  }